

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurl.cpp
# Opt level: O0

QDataStream * operator>>(QDataStream *in,QUrl *url)

{
  long lVar1;
  QDataStream *in_RDI;
  long in_FS_OFFSET;
  QByteArray u;
  ParsingMode in_stack_ffffffffffffff7c;
  QString *in_stack_ffffffffffffff80;
  QUrl *in_stack_ffffffffffffff88;
  QByteArray *in_stack_ffffffffffffffa0;
  QDataStream *in_stack_ffffffffffffffa8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QByteArray::QByteArray((QByteArray *)0x300aa0);
  operator>>(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  QString::fromLatin1<void>((QByteArray *)in_stack_ffffffffffffff80);
  QUrl::setUrl(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
  QString::~QString((QString *)0x300ae9);
  QByteArray::~QByteArray((QByteArray *)0x300afd);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QDataStream &operator>>(QDataStream &in, QUrl &url)
{
    QByteArray u;
    in >> u;
    url.setUrl(QString::fromLatin1(u));
    return in;
}